

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

bit_reader_t * bit_reader_create(uint8_t *bytes,size_t len)

{
  bit_reader_t *r_00;
  size_t in_RSI;
  uint8_t *in_RDI;
  bit_reader_t *r;
  
  r_00 = (bit_reader_t *)calloc(1,0x28);
  if ((bit_reader_create::reverse_table_created & 1U) == 0) {
    create_reverse_table();
    bit_reader_create::reverse_table_created = true;
  }
  if (in_RDI != (uint8_t *)0x0) {
    bit_reader_reconfigure(r_00,in_RDI,in_RSI);
  }
  return r_00;
}

Assistant:

bit_reader_t *bit_reader_create(const uint8_t *bytes, size_t len) {
    bit_reader_t *r = calloc(1, sizeof(bit_reader_t));

    static bool reverse_table_created = false;

    if (!reverse_table_created) {
        create_reverse_table();
        reverse_table_created = true;
    }

    if (bytes) {
        bit_reader_reconfigure(r, bytes, len);
    }

    return r;
}